

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O0

double IKasin(double f)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  double local_18;
  double f_local;
  
  local_18 = f;
  if ((-1.0000001 < f) && (f < 1.0000001)) {
    if (-1.0 < f) {
      if (f < 1.0) {
        f_local = asin(f);
      }
      else {
        f_local = 1.5707963267949;
      }
    }
    else {
      f_local = -1.5707963267949;
    }
    return f_local;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"ikfast exception: ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/src/abb_irb4600_40_255/ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x82);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,"IKasin");
  poVar1 = std::operator<<(poVar1,": Assertion \'");
  poVar1 = std::operator<<(poVar1,"f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH");
  std::operator<<(poVar1,"\' failed");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double IKasin(double f)
{
IKFAST_ASSERT( f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH ); // any more error implies something is wrong with the solver
if( f <= -1 ) return -IKPI_2;
else if( f >= 1 ) return IKPI_2;
return asin(f);
}